

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

void __thiscall irr::video::CNullDriver::OnResize(CNullDriver *this,dimension2d<unsigned_int> *size)

{
  int iVar1;
  dimension2d<unsigned_int> *in_RSI;
  vector2d<int> *in_RDI;
  dimension2d<int> in_stack_ffffffffffffffd0;
  vector2d<int> local_28;
  vector2d<int> local_20;
  vector2d<int> local_18;
  dimension2d<unsigned_int> *local_10;
  
  local_10 = in_RSI;
  iVar1 = core::rect<int>::getWidth((rect<int> *)(in_RDI + 0x26));
  if (iVar1 == in_RDI[0x28].X) {
    iVar1 = core::rect<int>::getHeight((rect<int> *)(in_RDI + 0x26));
    if (iVar1 == in_RDI[0x28].Y) {
      core::vector2d<int>::vector2d(&local_28,0,0);
      core::dimension2d<int>::dimension2d<unsigned_int>
                ((dimension2d<int> *)&stack0xffffffffffffffd0,local_10);
      core::rect<int>::rect<int>
                ((rect<int> *)in_stack_ffffffffffffffd0,in_RDI,(dimension2d<int> *)0x30cecc);
      in_RDI[0x26] = local_20;
      in_RDI[0x27] = local_18;
    }
  }
  *(dimension2d<unsigned_int> *)(in_RDI + 0x28) = *local_10;
  return;
}

Assistant:

void CNullDriver::OnResize(const core::dimension2d<u32> &size)
{
	if (ViewPort.getWidth() == (s32)ScreenSize.Width &&
			ViewPort.getHeight() == (s32)ScreenSize.Height)
		ViewPort = core::rect<s32>(core::position2d<s32>(0, 0),
				core::dimension2di(size));

	ScreenSize = size;
}